

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

int nghttp2_frame_unpack_settings_payload2
              (nghttp2_settings_entry **iv_ptr,size_t *niv_ptr,uint8_t *payload,size_t payloadlen,
              nghttp2_mem *mem)

{
  nghttp2_settings_entry *pnVar1;
  size_t off;
  size_t i;
  nghttp2_mem *mem_local;
  size_t payloadlen_local;
  uint8_t *payload_local;
  size_t *niv_ptr_local;
  nghttp2_settings_entry **iv_ptr_local;
  
  *niv_ptr = payloadlen / 6;
  if (*niv_ptr == 0) {
    *iv_ptr = (nghttp2_settings_entry *)0x0;
    iv_ptr_local._4_4_ = 0;
  }
  else {
    pnVar1 = (nghttp2_settings_entry *)nghttp2_mem_malloc(mem,*niv_ptr << 3);
    *iv_ptr = pnVar1;
    if (*iv_ptr == (nghttp2_settings_entry *)0x0) {
      iv_ptr_local._4_4_ = -0x385;
    }
    else {
      for (off = 0; off < *niv_ptr; off = off + 1) {
        nghttp2_frame_unpack_settings_entry(*iv_ptr + off,payload + off * 6);
      }
      iv_ptr_local._4_4_ = 0;
    }
  }
  return iv_ptr_local._4_4_;
}

Assistant:

int nghttp2_frame_unpack_settings_payload2(nghttp2_settings_entry **iv_ptr,
                                           size_t *niv_ptr,
                                           const uint8_t *payload,
                                           size_t payloadlen,
                                           nghttp2_mem *mem) {
  size_t i;

  *niv_ptr = payloadlen / NGHTTP2_FRAME_SETTINGS_ENTRY_LENGTH;

  if (*niv_ptr == 0) {
    *iv_ptr = NULL;

    return 0;
  }

  *iv_ptr =
      nghttp2_mem_malloc(mem, (*niv_ptr) * sizeof(nghttp2_settings_entry));

  if (*iv_ptr == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  for (i = 0; i < *niv_ptr; ++i) {
    size_t off = i * NGHTTP2_FRAME_SETTINGS_ENTRY_LENGTH;
    nghttp2_frame_unpack_settings_entry(&(*iv_ptr)[i], &payload[off]);
  }

  return 0;
}